

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O0

void TTD::NSSnapObjects::EmitAddtlInfo_SnapArrayInfoCore<int>
               (SnapArrayInfo<int> *arrayInfo,FileWriter *writer)

{
  uint uVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  byte local_39;
  uint local_34;
  uint32 j;
  uint32 i;
  SnapArrayInfoBlock<int> *currInfo_1;
  SnapArrayInfoBlock<int> *currInfo;
  uint32 blockCount;
  FileWriter *writer_local;
  SnapArrayInfo<int> *arrayInfo_local;
  
  FileWriter::WriteLengthValue(writer,arrayInfo->Length,CommaSeparator);
  currInfo._4_4_ = 0;
  for (currInfo_1 = arrayInfo->Data; currInfo_1 != (SnapArrayInfoBlock<int> *)0x0;
      currInfo_1 = currInfo_1->Next) {
    currInfo._4_4_ = currInfo._4_4_ + 1;
  }
  FileWriter::WriteLengthValue(writer,currInfo._4_4_,CommaAndBigSpaceSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  (*writer->_vptr_FileWriter[8])(writer,1);
  for (_j = arrayInfo->Data; _j != (SnapArrayInfoBlock<int> *)0x0; _j = _j->Next) {
    local_39 = 2;
    if (_j != arrayInfo->Data) {
      local_39 = 3;
    }
    (*writer->_vptr_FileWriter[6])(writer,(ulong)local_39);
    FileWriter::WriteUInt32(writer,index,_j->FirstIndex,NoSeparator);
    FileWriter::WriteUInt32(writer,offset,_j->LastIndex,CommaSeparator);
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    uVar2 = extraout_RDX;
    for (local_34 = _j->FirstIndex; local_34 < _j->LastIndex; local_34 = local_34 + 1) {
      uVar1 = local_34 - _j->FirstIndex;
      (*writer->_vptr_FileWriter[6])
                (writer,(ulong)(uVar1 != 0),CONCAT71((int7)((ulong)uVar2 >> 8),1),
                 (ulong)CONCAT31((int3)(uVar1 >> 8),uVar1 != 0));
      FileWriter::WriteInt32(writer,isValid,(uint)_j->ArrayValidTags[uVar1],NoSeparator);
      if (_j->ArrayValidTags[uVar1] != '\0') {
        SnapArrayInfo_EmitValue(_j->ArrayRangeContents[uVar1],writer);
      }
      (*writer->_vptr_FileWriter[7])();
      uVar2 = extraout_RDX_00;
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    (*writer->_vptr_FileWriter[7])(writer,0);
  }
  (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
  (*writer->_vptr_FileWriter[5])(writer,2);
  return;
}

Assistant:

void EmitAddtlInfo_SnapArrayInfoCore(SnapArrayInfo<T>* arrayInfo, FileWriter* writer)
        {
            writer->WriteLengthValue(arrayInfo->Length, NSTokens::Separator::CommaSeparator);

            uint32 blockCount = 0;
            for(SnapArrayInfoBlock<T>* currInfo = arrayInfo->Data; currInfo != nullptr; currInfo = currInfo->Next)
            {
                blockCount++;
            }

            writer->WriteLengthValue(blockCount, NSTokens::Separator::CommaAndBigSpaceSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            writer->AdjustIndent(1);
            for(SnapArrayInfoBlock<T>* currInfo = arrayInfo->Data; currInfo != nullptr; currInfo = currInfo->Next)
            {
                writer->WriteRecordStart(currInfo == arrayInfo->Data ? NSTokens::Separator::BigSpaceSeparator : NSTokens::Separator::CommaAndBigSpaceSeparator);
                writer->WriteUInt32(NSTokens::Key::index, currInfo->FirstIndex);
                writer->WriteUInt32(NSTokens::Key::offset, currInfo->LastIndex, NSTokens::Separator::CommaSeparator);

                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                for(uint32 i = currInfo->FirstIndex; i < currInfo->LastIndex; ++i)
                {
                    uint32 j = (i - currInfo->FirstIndex);
                    writer->WriteRecordStart(j == 0 ? NSTokens::Separator::NoSeparator : NSTokens::Separator::CommaSeparator);

                    writer->WriteInt32(NSTokens::Key::isValid, currInfo->ArrayValidTags[j]);
                    if(currInfo->ArrayValidTags[j])
                    {
                        SnapArrayInfo_EmitValue(currInfo->ArrayRangeContents[j], writer);
                    }
                    writer->WriteRecordEnd();
                }
                writer->WriteSequenceEnd();
                writer->WriteRecordEnd();
            }
            writer->AdjustIndent(-1);
            writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);
        }